

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O1

_class * file_class_new(char *name,_func_t_file_handle_ptr_t_symbol_ptr_int_t_atom_ptr *ctor,
                       _func_void_t_file_handle_ptr *dtor,
                       _func_void_t_file_handle_ptr_t_symbol_ptr *symfun,t_filenew_flag flag)

{
  undefined8 in_RAX;
  uint uVar2;
  t_symbol *ptVar1;
  _class *c;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym(name);
  c = class_new(ptVar1,(t_newmethod)ctor,(t_method)dtor,0x68,0,A_GIMME,(ulong)uVar2 << 0x20);
  if ((flag & VERBOSE) != DEFAULT) {
    ptVar1 = gensym("verbose");
    class_addmethod(c,file_set_verbosity,ptVar1,A_FLOAT,0);
  }
  if ((flag & MODE) != DEFAULT) {
    ptVar1 = gensym("creationmode");
    class_addmethod(c,file_set_creationmode,ptVar1,A_GIMME,0);
  }
  if (symfun != (_func_void_t_file_handle_ptr_t_symbol_ptr *)0x0) {
    class_addsymbol(c,(t_method)symfun);
  }
  ptVar1 = gensym("file");
  class_sethelpsymbol(c,ptVar1);
  return c;
}

Assistant:

static t_class*file_class_new(const char*name
    , t_file_handle* (*ctor)(t_symbol*,int,t_atom*), void (*dtor)(t_file_handle*)
    , void (*symfun)(t_file_handle*, t_symbol*)
    , t_filenew_flag flag
    ) {
    t_class*cls = class_new(gensym(name),
        (t_newmethod)ctor, (t_method)dtor,
        sizeof(t_file_handle), 0, A_GIMME, 0);
    if (flag & VERBOSE)
        class_addmethod(cls, (t_method)file_set_verbosity, gensym("verbose"), A_FLOAT, 0);
    if (flag & MODE)
        class_addmethod(cls, (t_method)file_set_creationmode, gensym("creationmode"), A_GIMME, 0);
    if(symfun)
        class_addsymbol(cls, (t_method)symfun);

    class_sethelpsymbol(cls, gensym("file"));
    return cls;
}